

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

_Bool is_in_array(int *hay,size_t length,int needle)

{
  ulong local_30;
  size_t n;
  int needle_local;
  size_t length_local;
  int *hay_local;
  
  local_30 = 0;
  while( true ) {
    if (length <= local_30) {
      return false;
    }
    if (hay[local_30] == needle) break;
    if (needle < hay[local_30]) {
      return false;
    }
    local_30 = local_30 + 1;
  }
  return true;
}

Assistant:

bool is_in_array(const int* hay, const size_t length, const int needle) {
  for (size_t n = 0; n < length; n++) {
    if (hay[n] == needle) return true;
    else if (hay[n] > needle) return false;
  }
  return false;
}